

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Test3DCompressed(SubImageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar8;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (this->m_reference_compressed_3D == (GLubyte *)0x0) {
    bVar1 = true;
  }
  else {
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
    (**(code **)(lVar7 + 0x2f8))
              (pEVar8,0,0,0,0,4,4,4,this->m_reference_compressed_3D_format,
               this->m_reference_compressed_3D_size,this->m_reference_compressed_3D);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage3D"
                       ,"texture is not the name of an existing texture object.");
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_3D_compressed;
    (**(code **)(lVar7 + 0x2f8))
              (pEVar8,0,0,0,0,4,4,4,0x8226,this->m_reference_compressed_3D_size,
               this->m_reference_compressed_3D);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x500,"glCompressedTextureSubImage3D"
                       ,
                       "internalformat is of the generic compressed internal formats: COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_3D_compressed;
    (**(code **)(lVar7 + 0x2f8))
              (pEVar8,0,0,0,0,4,4,4,this->m_format_compressed_not_matching,
               this->m_reference_compressed_3D_size,this->m_reference_compressed_3D);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage3D"
                       ,
                       "format does not match the internal format of the texture image being modified, since these commands do not provide for image format conversion."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_3D_compressed;
    (**(code **)(lVar7 + 0x2f8))
              (pEVar8,0,0,0,0,4,4,4,this->m_reference_compressed_3D_format,
               this->m_reference_compressed_3D_size + -1,this->m_reference_compressed_3D);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x501,"glCompressedTextureSubImage3D"
                       ,
                       "imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data."
                      );
    bVar2 = (bVar4 && bVar3) && (bVar2 && bVar1);
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x28ff);
    (**(code **)(lVar7 + 0xcf8))(0x88ec,0x88ba);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_3D_compressed;
      (**(code **)(lVar7 + 0x2f8))
                (pEVar8,0,0,0,0,4,4,4,this->m_reference_compressed_3D_format,
                 this->m_reference_compressed_3D_size,0);
      bVar1 = ErrorsUtilities::CheckErrorAndLog
                        (pEVar8,(this->super_TestCase).m_context,0x502,
                         "glCompressedTextureSubImage3D",
                         "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                        );
      bVar2 = bVar2 && bVar1;
      (**(code **)(lVar7 + 0x1670))(0x88ec);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x290d);
      (**(code **)(lVar7 + 0x40))(0x88ec,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2910);
    }
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x291a);
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_3D_compressed;
    (**(code **)(lVar7 + 0x2f8))
              (pEVar8,0,0,0,0,4,4,4,this->m_reference_compressed_3D_format,
               this->m_reference_compressed_3D_size,0x400);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage3D"
                       ,
                       "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                      );
    bVar1 = (bool)(bVar1 & bVar2);
    (**(code **)(lVar7 + 0x40))(0x88ec,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2924);
  }
  return bVar1;
}

Assistant:

bool SubImageErrorsTest::Test3DCompressed()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Do tests only if compressed 3D textures are supported. */
	if (DE_NULL != m_reference_compressed_3D)
	{
		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage3D
		 if texture is not the name of an existing texture object. */
		{
			gl.compressedTextureSubImage3D(m_to_invalid, 0, 0, 0, 0, s_reference_width, s_reference_height,
										   s_reference_depth, m_reference_compressed_3D_format,
										   m_reference_compressed_3D_size, m_reference_compressed_3D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage3D",
									  "texture is not the name of an existing texture object.");
		}

		/* Check that INVALID_ENUM is generated by CompressedTextureSubImage3D if
		 internalformat is of the generic compressed internal formats:
		 COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA.
		 COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA. */
		{
			gl.compressedTextureSubImage3D(m_to_3D_compressed, 0, 0, 0, 0, s_reference_width, s_reference_height,
										   s_reference_depth, GL_COMPRESSED_RG, m_reference_compressed_3D_size,
										   m_reference_compressed_3D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glCompressedTextureSubImage3D",
									  "internalformat is of the generic compressed internal formats: COMPRESSED_RED, "
									  "COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or "
									  "COMPRESSED_SRGB_ALPHA.");
		}

		/* Check that INVALID_OPERATION is generated if format does not match the
		 internal format of the texture image being modified, since these
		 commands do not provide for image format conversion. */
		{
			gl.compressedTextureSubImage3D(m_to_3D_compressed, 0, 0, 0, 0, s_reference_width, s_reference_height,
										   s_reference_depth, m_format_compressed_not_matching,
										   m_reference_compressed_3D_size, m_reference_compressed_3D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage3D",
									  "format does not match the internal format of the texture image being modified, "
									  "since these commands do not provide for image format conversion.");
		}

		/* Check that INVALID_VALUE is generated by CompressedTextureSubImage3D if
		 imageSize is not consistent with the format, dimensions, and contents of
		 the specified compressed image data. */
		{
			gl.compressedTextureSubImage3D(m_to_3D_compressed, 0, 0, 0, 0, s_reference_width, s_reference_height,
										   s_reference_depth, m_reference_compressed_3D_format,
										   m_reference_compressed_3D_size - 1, m_reference_compressed_3D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCompressedTextureSubImage3D",
									  "imageSize is not consistent with the format, dimensions, and contents of the "
									  "specified compressed image data.");
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage3D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the buffer object's data store is currently mapped. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.mapBuffer(GL_PIXEL_UNPACK_BUFFER, GL_READ_WRITE);

			if (GL_NO_ERROR == gl.getError())
			{
				gl.compressedTextureSubImage3D(m_to_3D_compressed, 0, 0, 0, 0, s_reference_width, s_reference_height,
											   s_reference_depth, m_reference_compressed_3D_format,
											   m_reference_compressed_3D_size, NULL);
				is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage3D",
										  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target "
										  "and the buffer object's data store is currently mapped.");

				gl.unmapBuffer(GL_PIXEL_UNPACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

				gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
			}
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage3D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the data would be unpacked from the buffer object such that
		 the memory reads required would exceed the data store size. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.compressedTextureSubImage3D(m_to_3D_compressed, 0, 0, 0, 0, s_reference_width, s_reference_height,
										   s_reference_depth, m_reference_compressed_3D_format,
										   m_reference_compressed_3D_size, (glw::GLubyte*)NULL + s_reference_size * 2);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage3D",
									  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and "
									  "the buffer object's data store is currently mapped.");

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
		}
	}

	return is_ok;
}